

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

void __thiscall n_e_s::core::Mos6502::Mos6502(Mos6502 *this,CpuRegisters *registers,IMmu *mmu)

{
  IMmu *mmu_local;
  CpuRegisters *registers_local;
  Mos6502 *this_local;
  
  IMos6502::IMos6502(&this->super_IMos6502);
  (this->super_IMos6502).super_ICpu._vptr_ICpu = (_func_int **)&PTR__Mos6502_00222d30;
  this->registers_ = registers;
  this->mmu_ = mmu;
  Stack::Stack(&this->stack_,this->registers_,this->mmu_);
  CpuState::CpuState(&this->state_);
  this->nmi_ = false;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(undefined8 *)&this->pipeline_ = 0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->pipeline_).steps_.
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  Pipeline::Pipeline(&this->pipeline_);
  this->effective_address_ = 0;
  this->tmp_ = '\0';
  this->tmp2_ = '\0';
  this->is_crossing_page_boundary_ = false;
  return;
}

Assistant:

Mos6502::Mos6502(CpuRegisters *const registers, IMmu *const mmu)
        : registers_(registers), mmu_(mmu), stack_(registers_, mmu_) {}